

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O2

void __thiscall
absl::lts_20240722::strings_internal::BigUnsigned<4>::SetToZero(BigUnsigned<4> *this)

{
  std::__fill_n_a<unsigned_int*,int,unsigned_int>(this->words_,this->size_);
  this->size_ = 0;
  return;
}

Assistant:

void SetToZero() {
    std::fill_n(words_, size_, 0u);
    size_ = 0;
  }